

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_global(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  CPrsArrayList *pCVar1;
  byte *pbVar2;
  CTcStreamAnchor **ppCVar3;
  undefined1 *puVar4;
  byte bVar5;
  byte bVar6;
  uint self;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  CVmObjPageEntry *pCVar10;
  anon_union_8_8_cb74652f_for_val aVar11;
  vm_datatype_t *pvVar12;
  vm_val_t *pvVar13;
  int iVar14;
  vm_bif_desc *pvVar15;
  CTcSymFunc *this_00;
  undefined *puVar16;
  vm_val_t *pvVar17;
  CVmMetaclass *pCVar18;
  size_t sVar19;
  tc_metaclass_t meta;
  ulong uVar20;
  vm_val_t symval;
  CVmFuncPtr fp;
  vm_val_t symstr;
  
  if (this->globals_ == 0) {
    return (CTcSymbol *)(CTcSymFunc *)0x0;
  }
  this_00 = (CTcSymFunc *)0x0;
  symstr.val.obj = CVmObjString::create(0,sym,len);
  pvVar17 = sp_;
  symstr.typ = VM_OBJ;
  aVar11._4_4_ = symstr.val._4_4_;
  aVar11.obj = symstr.val.obj;
  pvVar13 = sp_ + 1;
  *(ulong *)sp_ = CONCAT44(symstr._4_4_,5);
  sp_ = pvVar13;
  pvVar17->val = aVar11;
  self = this->globals_;
  pvVar17 = &symval;
  CVmObject::index_val_ov
            ((CVmObject *)
             ((long)&G_obj_table_X.pages_[self >> 0xc]->ptr_ + (ulong)((self & 0xfff) * 0x18)),
             pvVar17,self,&symstr);
  pvVar13 = sp_;
  pvVar12 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar12 = symval.typ;
  *(undefined4 *)&pvVar13->field_0x4 = symval._4_4_;
  (pvVar13->val).obj = symval.val.obj;
  *(undefined4 *)((long)&pvVar13->val + 4) = symval.val._4_4_;
  switch(symval.typ) {
  case VM_OBJ:
    pCVar18 = CVmObjClass::metaclass_reg_;
    iVar14 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                    [(ulong)symval.val.obj & 0xfff].ptr_ + 8))();
    uVar20 = (ulong)symval.val.obj;
    pCVar10 = G_obj_table_X.pages_[symval.val.obj >> 0xc];
    if (iVar14 != 0) {
      this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x60,(size_t)pCVar18);
      uVar7 = **(undefined4 **)((long)&pCVar10[uVar20 & 0xfff].ptr_ + 8);
      CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
      *(undefined4 *)
       &(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
        super_CVmHashEntry.field_0x24 = 9;
      *(undefined4 *)&(this_00->super_CTcSymFuncBase).anchor_ = uVar7;
      *(undefined4 *)&(this_00->super_CTcSymFuncBase).mod_global_ = 0;
      (this_00->super_CTcSymFuncBase).code_body_ = (CTPNCodeBody *)0x0;
      (this_00->super_CTcSymFuncBase).argc_ = 0;
      (this_00->super_CTcSymFuncBase).opt_argc_ = 0;
      *(vm_obj_id_t *)((long)&(this_00->super_CTcSymFuncBase).mod_global_ + 4) = symval.val.obj;
      (this_00->super_CTcSymFuncBase).mod_base_ = (CTcSymFunc *)0x0;
      (this_00->super_CTcSymFuncBase).fixups_ = (CTcAbsFixup *)0x0;
      pCVar1 = &(this_00->super_CTcSymFuncBase).mod_base_ofs_list_;
      *(byte *)&(pCVar1->super_CArrayList)._vptr_CArrayList =
           *(byte *)&(pCVar1->super_CArrayList)._vptr_CArrayList & 0xfc;
      puVar16 = &CTcSymMetaclass::vtable;
      goto LAB_0027b34e;
    }
    meta = TC_META_TADSOBJ;
    sVar19 = 0;
    iVar14 = (**(code **)(*(long *)&pCVar10[uVar20 & 0xfff].ptr_ + 0x70))();
    if (iVar14 == 0) {
      pCVar18 = CVmObjTads::metaclass_reg_;
      iVar14 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                      [symval.val.obj & 0xfff].ptr_ + 8))();
      if (iVar14 == 0) {
        pCVar18 = CVmObjGramProd::metaclass_reg_;
        iVar14 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                        [symval.val.obj & 0xfff].ptr_ + 8))();
        meta = TC_META_GRAMPROD;
        if (iVar14 == 0) {
          pCVar18 = CVmObjDict::metaclass_reg_;
          iVar14 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                          [symval.val.obj & 0xfff].ptr_ + 8))();
          meta = TC_META_DICT;
          if (iVar14 == 0) {
            pCVar18 = CVmObjIntClsMod::metaclass_reg_;
            iVar14 = (**(code **)(*(long *)&G_obj_table_X.pages_[symval.val.obj >> 0xc]
                                            [symval.val.obj & 0xfff].ptr_ + 8))();
            meta = -(uint)(iVar14 == 0) | TC_META_ICMOD;
          }
        }
      }
      this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)pCVar18);
      CTcSymObj::CTcSymObj((CTcSymObj *)this_00,sym,len,0,symval.val.obj,0,meta,(CTcDictEntry *)0x0)
      ;
      goto switchD_0027b0b8_caseD_7;
    }
    this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,sVar19);
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry.field_0x24 = 2;
    (this_00->super_CTcSymFuncBase).fixups_ = (CTcAbsFixup *)(ulong)symval.val.obj;
    (this_00->super_CTcSymFuncBase).anchor_ = (CTcStreamAnchor *)0xffffffff;
    (this_00->super_CTcSymFuncBase).code_body_ = (CTPNCodeBody *)0x0;
    (this_00->super_CTcSymFuncBase).argc_ = 0;
    (this_00->super_CTcSymFuncBase).opt_argc_ = 0;
    (this_00->super_CTcSymFuncBase).mod_base_ = (CTcSymFunc *)0x0;
    (this_00->super_CTcSymFuncBase).mod_global_ = (CTcSymFunc *)0x0;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList._vptr_CArrayList =
         (_func_int **)0x0;
    *(undefined4 *)&this_00->field_0x90 = 0xffffffff;
    this_00[1].super_CTcSymFuncBase.super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
    super_CVmHashEntry.len_ = 0;
    this_00[1].super_CTcSymFuncBase.super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
    super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)0x0;
    this_00[1].super_CTcSymFuncBase.super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
    super_CVmHashEntry.nxt_ = (CVmHashEntry *)0x0;
    *(undefined4 *)
     &this_00[1].super_CTcSymFuncBase.super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry.str_ = 0;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList.arr_ =
         (array_list_ele_t *)0x0;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList.alloc_ = 0;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList.cnt_ = 0;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList.inc_siz_ = 0;
    *(undefined8 *)&(this_00->super_CTcSymFuncBase).field_0x80 = 0;
    this_00->abs_addr_ = 0;
    puVar4 = &this_00[1].super_CTcSymFuncBase.super_CTcSymbol.super_CTcSymbolBase.
              super_CVmHashEntryCS.super_CVmHashEntry.field_0x20;
    *(ushort *)puVar4 = *(ushort *)puVar4 & 0xf000;
    puVar16 = &CTcSymFuncObj::vtable;
    break;
  case VM_PROP:
    this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)pvVar17);
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry.field_0x24 = 3;
    *(vm_prop_id_t *)&(this_00->super_CTcSymFuncBase).fixups_ = symval.val.prop;
    pbVar2 = (byte *)((long)&(this_00->super_CTcSymFuncBase).fixups_ + 2);
    *pbVar2 = *pbVar2 & 0xf8;
    puVar16 = &CTcSymProp::vtable;
    break;
  default:
    goto switchD_0027b0b8_caseD_7;
  case VM_FUNCPTR:
    sVar19 = (size_t)symval.val.obj;
    CVmFuncPtr::CVmFuncPtr(&fp,symval.val.ofs);
    this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,sVar19);
    bVar6 = *fp.p_;
    bVar5 = fp.p_[1];
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry.field_0x24 = 1;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList.arr_ =
         (array_list_ele_t *)0x0;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList.cnt_ = 0;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList.alloc_ = 0x10;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList.inc_siz_ = 0x10;
    (this_00->super_CTcSymFuncBase).mod_base_ofs_list_.super_CArrayList._vptr_CArrayList =
         (_func_int **)&PTR__CArrayList_00354bf8;
    (this_00->super_CTcSymFuncBase).argc_ = bVar6 & 0x7f;
    (this_00->super_CTcSymFuncBase).opt_argc_ = (uint)bVar5;
    (this_00->super_CTcSymFuncBase).mod_base_ = (CTcSymFunc *)0x0;
    (this_00->super_CTcSymFuncBase).mod_global_ = (CTcSymFunc *)0x0;
    (this_00->super_CTcSymFuncBase).fixups_ = (CTcAbsFixup *)0x0;
    (this_00->super_CTcSymFuncBase).anchor_ = (CTcStreamAnchor *)0x0;
    (this_00->super_CTcSymFuncBase).code_body_ = (CTPNCodeBody *)0x0;
    (this_00->super_CTcSymFuncBase).field_0x80 = bVar6 >> 7 | 0x82;
    (this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
    super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)&PTR__CTcSymFuncBase_0035b458;
    this_00->field_0x90 = this_00->field_0x90 & 0xfe;
    this_00->abs_addr_ = 0;
    CTcSymFunc::set_abs_addr(this_00,symval.val.enumval);
    goto switchD_0027b0b8_caseD_7;
  case VM_ENUM:
    this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,(size_t)pvVar17);
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry.field_0x24 = 10;
    (this_00->super_CTcSymFuncBase).fixups_ = (CTcAbsFixup *)(ulong)symval.val.obj;
    ppCVar3 = &(this_00->super_CTcSymFuncBase).anchor_;
    *(byte *)ppCVar3 = *(byte *)ppCVar3 & 0xfc;
    puVar16 = &CTcSymEnum::vtable;
    break;
  case VM_BIFPTR:
    sVar19 = (size_t)symval.val.prop;
    pvVar15 = CVmBifTable::get_desc
                        (G_bif_table_X,symval.val.obj & 0xffff,(uint)symval.val.bifptr.func_idx);
    if ((pvVar15 == (vm_bif_desc *)0x0) || (pvVar15->func == (_func_void_uint *)0x0)) {
      this_00 = (CTcSymFunc *)0x0;
      goto switchD_0027b0b8_caseD_7;
    }
    this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,sVar19);
    iVar14 = pvVar15->min_argc;
    iVar8 = pvVar15->opt_argc;
    iVar9 = pvVar15->varargs;
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,sym,len,0);
    *(undefined4 *)
     &(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry.field_0x24 = 6;
    *(vm_prop_id_t *)&(this_00->super_CTcSymFuncBase).fixups_ = symval.val.prop;
    *(unsigned_short *)((long)&(this_00->super_CTcSymFuncBase).fixups_ + 2) =
         symval.val.bifptr.func_idx;
    bVar6 = *(byte *)((long)&(this_00->super_CTcSymFuncBase).anchor_ + 4);
    *(int *)((long)&(this_00->super_CTcSymFuncBase).fixups_ + 4) = iVar14;
    *(int *)&(this_00->super_CTcSymFuncBase).anchor_ = iVar8 + iVar14;
    *(byte *)((long)&(this_00->super_CTcSymFuncBase).anchor_ + 4) =
         (byte)iVar9 & 1 | bVar6 & 0xfc | 2;
    puVar16 = &CTcSymBif::vtable;
LAB_0027b34e:
    (this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
    super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)(puVar16 + 0x10);
    goto switchD_0027b0b8_caseD_7;
  }
  (this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
  super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)(puVar16 + 0x10);
switchD_0027b0b8_caseD_7:
  sp_ = sp_ + -2;
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *find_global(const textchar_t *sym, size_t len)
    {
        /* if there's no user-code table, there's nothing to search */
        if (globals_ == VM_INVALID_OBJ)
            return 0;

        /* presume we won't find a symbol */
        CTcSymbol *ret = 0;
        
        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* create a string for the symbol name; stack it for gc protection */
        vm_val_t symstr;
        symstr.set_obj(CVmObjString::create(vmg_ FALSE, sym, len));
        G_stk->push(&symstr);

        /* look up the symbol string in the table */
        vm_val_t symval;
        vm_objp(vmg_ globals_)->index_val_ov(vmg_ &symval, globals_, &symstr);
        G_stk->push(&symval);

        /* check what we found */
        switch (symval.typ)
        {
        case VM_OBJ:
            /* it's an object - map it to CTcSymObj or CTcSymMetaclass */
            if (CVmObjClass::is_intcls_obj(vmg_ symval.val.obj))
            {
                /* 
                 *   it's an IntrinsicClass object - this represents a
                 *   metaclass, so map it to a CTcSymMetaclass symbol 
                 */
                CVmObjClass *cl = (CVmObjClass *)vm_objp(vmg_ symval.val.obj);
                ret = new CTcSymMetaclass(sym, len, FALSE,
                                          cl->get_meta_idx(),
                                          symval.val.obj);
            }
            else if (vm_objp(vmg_ symval.val.obj)->get_invoker(vmg_ 0))
            {
                /* 
                 *   it's an invokable object - create a function-like object
                 *   symbol for it 
                 */
                ret = new CTcSymFuncObj(sym, len, FALSE, symval.val.obj,
                                        FALSE, TC_META_UNKNOWN, 0);
            }
            else
            {
                /* 
                 *   It's not an IntrinsicClass object, so it's a regular
                 *   CTcSymObj symbol.  Check for special metaclasses that
                 *   the compiler is aware of.  
                 */
                tc_metaclass_t meta = TC_META_UNKNOWN;

                if (CVmObjTads::is_tadsobj_obj(vmg_ symval.val.obj))
                    meta = TC_META_TADSOBJ;
                else if (CVmObjGramProd::is_gramprod_obj(vmg_ symval.val.obj))
                    meta = TC_META_GRAMPROD;
                else if (CVmObjDict::is_dictionary_obj(vmg_ symval.val.obj))
                    meta = TC_META_DICT;
                else if (CVmObjIntClsMod::is_intcls_mod_obj(vmg_ symval.val.obj))
                    meta = TC_META_ICMOD;

                /* create the object symbol */
                ret = new CTcSymObj(sym, len, FALSE, symval.val.obj,
                                    FALSE, meta, 0);
            }